

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_fuseequal(ASMState *as,IRIns *ir)

{
  IRIns *ir_local;
  ASMState *as_local;
  
  if ((*(char *)((long)ir + -3) == ':') && ((uint)(ir->field_0).op1 == as->curins - 1)) {
    as->curins = as->curins - 1;
    asm_href(as,ir + -1,(uint)(ir->field_1).o);
  }
  else {
    asm_comp(as,ir);
  }
  return;
}

Assistant:

static void asm_fuseequal(ASMState *as, IRIns *ir)
{
  /* Fuse HREF + EQ/NE. */
  if ((ir-1)->o == IR_HREF && ir->op1 == as->curins-1) {
    as->curins--;
    asm_href(as, ir-1, (IROp)ir->o);
  } else {
    asm_equal(as, ir);
  }
}